

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall higan::TcpServer::~TcpServer(TcpServer *this)

{
  std::_Function_base::~_Function_base(&(this->newconnection_callback_).super__Function_base);
  std::_Function_base::~_Function_base(&(this->message_callback_).super__Function_base);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<higan::TcpConnection>_>_>_>
  ::~_Rb_tree(&(this->connection_map_)._M_t);
  Acceptor::~Acceptor(&this->acceptor_);
  std::__cxx11::string::~string((string *)&this->server_addr_);
  std::__cxx11::string::~string((string *)&this->server_name_);
  EventLoopThreadPool::~EventLoopThreadPool(&this->thread_pool_);
  return;
}

Assistant:

TcpServer::~TcpServer()
{

}